

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  uint *pk_parity;
  char cVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  secp256k1_xonly_pubkey *pubkey;
  secp256k1_scalar sVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  uint32_t uVar10;
  int iVar11;
  uchar *p2;
  ulong uVar12;
  FILE *__stream;
  size_t sVar13;
  secp256k1_ge *psVar14;
  secp256k1_gej *psVar15;
  secp256k1_context *psVar16;
  undefined1 *num;
  void *pvVar17;
  void *pvVar18;
  ulong extraout_RAX;
  int j;
  uint uVar19;
  uint uVar20;
  secp256k1_fe *psVar21;
  void *pvVar22;
  secp256k1_gej *gen;
  secp256k1_gej *gen_00;
  bool bVar23;
  uint uVar24;
  char *pcVar25;
  long lVar26;
  FILE *pFVar27;
  uint64_t uVar28;
  uint uVar29;
  uint64_t *puVar30;
  secp256k1_pubkey *pubkey_00;
  ulong uVar31;
  undefined4 uVar32;
  secp256k1_context *psVar33;
  secp256k1_ge *r;
  uint64_t *puVar34;
  secp256k1_gej *psVar35;
  code *na_00;
  uint64_t uVar36;
  ulong uVar37;
  ulong uVar38;
  int iVar39;
  uint uVar40;
  secp256k1_fe *b;
  int pos;
  long lVar41;
  secp256k1_scalar *psVar42;
  uint uVar43;
  secp256k1_context *psVar44;
  undefined1 *puVar45;
  undefined1 *puVar46;
  secp256k1_scalar *r_00;
  secp256k1_keypair *keypair;
  uchar *p1;
  secp256k1_context *a;
  bool bVar47;
  byte bVar48;
  undefined1 auVar49 [16];
  secp256k1_gej *local_1af0;
  secp256k1_gej *local_1ae8;
  secp256k1_scalar *local_1ad8;
  ulong local_1ad0;
  secp256k1_scalar *local_1ac8;
  int local_1abc;
  secp256k1_gej *local_1ab8;
  uint64_t local_1ab0;
  secp256k1_scalar ng_1;
  undefined1 auStack_1aa4 [12];
  secp256k1_ge *psStack_1aa0;
  undefined1 local_1a98 [16];
  undefined1 local_1a88 [16];
  int local_1a78;
  secp256k1_scalar ng;
  undefined1 auStack_1a64 [12];
  undefined8 uStack_1a60;
  undefined1 local_1a58 [16];
  int iStack_1a3c;
  secp256k1_scalar na;
  secp256k1_scalar sStack_1a34;
  uint64_t uStack_1a30;
  uint64_t local_1a28;
  uint64_t uStack_1a20;
  undefined4 local_1a18;
  undefined4 uStack_1a14;
  undefined8 uStack_1a10;
  _func_void_char_ptr_void_ptr *local_1a08;
  secp256k1_scalar *local_1a00;
  _func_void_char_ptr_void_ptr *local_19f8;
  secp256k1_context *local_19f0;
  secp256k1_scalar e;
  ulong local_19e0;
  secp256k1_context *local_19d8;
  uint64_t local_19d0;
  secp256k1_callback local_19c8;
  secp256k1_callback local_19b8;
  uint64_t local_19a8;
  secp256k1_scalar *local_19a0;
  secp256k1_fe *local_1998;
  secp256k1_gej *local_1990;
  _func_void_char_ptr_void_ptr *local_1988;
  undefined1 *local_1980;
  secp256k1_gej *local_1978;
  secp256k1_scalar e_1;
  secp256k1_nonce_function_hardened local_1968;
  int *local_1960;
  secp256k1_gej tmp_3;
  undefined1 local_17f8 [32];
  uchar rand32 [32];
  secp256k1_ge generated;
  secp256k1_xonly_pubkey sStack_14f8;
  secp256k1_scalar scalar_i;
  undefined1 auStack_14b4 [12];
  uint64_t uStack_14b0;
  undefined1 local_14a8 [16];
  uchar local_1498 [4];
  uchar auStack_1494 [4];
  int iStack_1490;
  int iStack_148c;
  uchar seed16 [16];
  byte abStack_1198 [32];
  byte local_1178;
  uint64_t local_1148 [130];
  secp256k1_ge group [13];
  undefined1 auStack_7f0 [8];
  secp256k1_gej groupj [13];
  
  bVar48 = 0;
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  printf("Exhaustive tests for order %lu\n");
  local_1af0 = (secp256k1_gej *)(ulong)(uint)argc;
  local_1ab8 = (secp256k1_gej *)argv;
  if (argc < 2) {
    printf("test count = %i\n",(ulong)(uint)count);
  }
  else {
    uVar12 = strtol(argv[1],(char **)0x0,0);
    count = (int)uVar12;
    printf("test count = %i\n",uVar12 & 0xffffffff);
    if (argc != 2) {
      pcVar25 = argv[2];
      seed16[0] = '\0';
      seed16[1] = '\0';
      seed16[2] = '\0';
      seed16[3] = '\0';
      seed16[4] = '\0';
      seed16[5] = '\0';
      seed16[6] = '\0';
      seed16[7] = '\0';
      seed16[8] = '\0';
      seed16[9] = '\0';
      seed16[10] = '\0';
      seed16[0xb] = '\0';
      seed16[0xc] = '\0';
      seed16[0xd] = '\0';
      seed16[0xe] = '\0';
      seed16[0xf] = '\0';
      if ((pcVar25 != (char *)0x0) && (*pcVar25 != '\0')) {
        lVar41 = 0;
        do {
          local_1af0._0_4_ = argc;
          if (pcVar25[1] == '\0') goto LAB_00111ec3;
          iVar8 = __isoc99_sscanf(pcVar25,"%2hx",groupj);
          if (iVar8 != 1) goto LAB_00111ec3;
          seed16[lVar41] = (uchar)groupj[0].x.n[0];
          if (lVar41 == 0xf) goto LAB_00111ec3;
          lVar41 = lVar41 + 1;
          pcVar1 = pcVar25 + 2;
          pcVar25 = pcVar25 + 2;
          if (*pcVar1 == '\0') goto LAB_00111ec3;
        } while( true );
      }
    }
  }
  seed16[8] = '\0';
  seed16[9] = '\0';
  seed16[10] = '\0';
  seed16[0xb] = '\0';
  seed16[0xc] = '\0';
  seed16[0xd] = '\0';
  seed16[0xe] = '\0';
  seed16[0xf] = '\0';
  seed16[0] = '\0';
  seed16[1] = '\0';
  seed16[2] = '\0';
  seed16[3] = '\0';
  seed16[4] = '\0';
  seed16[5] = '\0';
  seed16[6] = '\0';
  seed16[7] = '\0';
  __stream = fopen("/dev/urandom","rb");
  if ((__stream != (FILE *)0x0) &&
     (sVar13 = fread(seed16,1,0x10,__stream), iVar8 = argc, sVar13 == 0x10)) goto LAB_00111ebb;
LAB_00114a9d:
  main_cold_1();
  iVar8 = (int)local_1af0;
  if ((extraout_RAX & 1) == 0) {
LAB_00111ebb:
    local_1af0._0_4_ = iVar8;
    fclose(__stream);
  }
LAB_00111ec3:
  na_00 = (code *)((ulong)seed16._0_8_ >> 0x18 & 0xff);
  lVar41 = 0;
  printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
         seed16._0_8_ & 0xff,(ulong)seed16._0_8_ >> 8 & 0xff);
  groupj[0].x.n[0] = 0xbb67ae856a09e667;
  groupj[0].x.n[1] = 0xa54ff53a3c6ef372;
  groupj[0].x.n[2] = 0x9b05688c510e527f;
  groupj[0].x.n[3] = 0x5be0cd191f83d9ab;
  groupj[0].z.n[0] = 0;
  secp256k1_sha256_write((secp256k1_sha256 *)groupj,(uchar *)"secp256k1 test init",0x13);
  secp256k1_sha256_write((secp256k1_sha256 *)groupj,seed16,0x10);
  psVar14 = group;
  secp256k1_sha256_finalize((secp256k1_sha256 *)groupj,(uchar *)psVar14);
  psVar15 = local_1ab8;
  do {
    psVar21 = (secp256k1_fe *)0x0;
    uVar12 = 0;
    do {
      uVar12 = (ulong)*(byte *)((long)(psVar14->x).n + (long)psVar21) | uVar12 << 8;
      psVar21 = (secp256k1_fe *)((long)psVar21->n + 1);
    } while (psVar21 != (secp256k1_fe *)0x8);
    secp256k1_test_state[lVar41] = uVar12;
    lVar41 = lVar41 + 1;
    psVar14 = (secp256k1_ge *)((psVar14->x).n + 1);
  } while (lVar41 != 4);
  if (4 < (int)local_1af0) {
    lVar41 = strtol((char *)(local_1ab8->x).n[3],(char **)0x0,0);
    num_cores = (uint32_t)lVar41;
    uVar12 = strtol((char *)(psVar15->x).n[4],(char **)0x0,0);
    this_core = (uint32_t)uVar12;
    if (((ulong)num_cores == 0) || (num_cores <= this_core)) {
LAB_00114ac5:
      main_cold_2();
      return 1;
    }
    printf("running tests for core %lu (out of [0..%lu])\n",uVar12 & 0xffffffff,(ulong)num_cores - 1
          );
  }
  psVar33 = (secp256k1_context *)0xd0;
  psVar14 = (secp256k1_ge *)malloc(0xd0);
  if (psVar14 == (secp256k1_ge *)0x0) goto LAB_00114b4f;
  psVar33 = (secp256k1_context *)0x130;
  psVar15 = (secp256k1_gej *)malloc(0x130);
  if (psVar15 != (secp256k1_gej *)0x0) {
    psVar33 = (secp256k1_context *)0x130;
    local_1af0 = (secp256k1_gej *)malloc(0x130);
    if (local_1af0 == (secp256k1_gej *)0x0) goto LAB_00114b59;
    secp256k1_gej_set_infinity(groupj);
    uVar24 = 0xff;
    do {
      secp256k1_gej_double_var(groupj,groupj,(secp256k1_fe *)0x0);
      if ((uVar24 < 0x20) && ((7U >> (uVar24 & 0x1f) & 1) != 0)) {
        psVar21 = (secp256k1_fe *)0x0;
        secp256k1_gej_add_ge_var(groupj,groupj,&secp256k1_ge_const_g,(secp256k1_fe *)0x0);
      }
      bVar47 = uVar24 != 0;
      uVar24 = uVar24 - 1;
    } while (bVar47);
    psVar33 = (secp256k1_context *)group;
    secp256k1_gej_double_var((secp256k1_gej *)psVar33,groupj,(secp256k1_fe *)0x0);
    iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar33,&secp256k1_ge_const_g);
    if (iVar8 == 0) {
LAB_00114b22:
      main_cold_71();
    }
    else {
      secp256k1_gej_set_infinity((secp256k1_gej *)group);
      secp256k1_gej_add_var((secp256k1_gej *)group,(secp256k1_gej *)group,groupj,psVar21);
      lVar26 = 0;
      secp256k1_gej_double_var(groupj,groupj,(secp256k1_fe *)0x0);
      memcpy(psVar15,groupj,0x98);
      secp256k1_gej_double_var(groupj,groupj,(secp256k1_fe *)0x0);
      secp256k1_gej_add_var((secp256k1_gej *)group,(secp256k1_gej *)group,groupj,psVar21);
      secp256k1_gej_double_var(groupj,groupj,(secp256k1_fe *)0x0);
      memcpy(psVar15 + 1,groupj,0x98);
      secp256k1_gej_neg(local_1af0,(secp256k1_gej *)group);
      secp256k1_gej_add_var(local_1af0 + 1,local_1af0,psVar15,psVar21);
      secp256k1_gej_verify(local_1af0);
      secp256k1_gej_verify(local_1af0 + 1);
      lVar41 = -1;
      bVar47 = true;
      do {
        bVar23 = bVar47;
        if (local_1af0[lVar26].infinity == 0) {
          r = psVar14 + lVar26;
          if (lVar41 == -1) {
            uVar36 = local_1af0[lVar26].z.n[0];
            uVar28 = local_1af0[lVar26].z.n[1];
            auVar49 = *(undefined1 (*) [16])(local_1af0[lVar26].z.n + 2);
            uVar32 = *(undefined4 *)((long)local_1af0[lVar26].z.n + 0x24);
            iVar8 = local_1af0[lVar26].z.magnitude;
            iVar9 = local_1af0[lVar26].z.normalized;
            *(int *)((r->x).n + 4) = (int)local_1af0[lVar26].z.n[4];
            *(undefined4 *)((long)(r->x).n + 0x24) = uVar32;
            (r->x).magnitude = iVar8;
            (r->x).normalized = iVar9;
            *(undefined1 (*) [16])((r->x).n + 2) = auVar49;
            (r->x).n[0] = uVar36;
            (r->x).n[1] = uVar28;
            lVar41 = lVar26;
          }
          else {
            secp256k1_fe_mul(&r->x,&psVar14[lVar41].x,&local_1af0[lVar26].z);
            lVar41 = lVar26;
          }
        }
        else {
          secp256k1_ge_set_infinity(psVar14 + lVar26);
        }
        lVar26 = 1;
        bVar47 = false;
      } while (bVar23);
      if (lVar41 == -1) goto LAB_00112349;
      psVar33 = (secp256k1_context *)group;
      secp256k1_fe_inv_var((secp256k1_fe *)psVar33,&psVar14[lVar41].x);
      if (lVar41 == 0) {
LAB_001122b8:
        lVar41 = 0;
      }
      else if (local_1af0->infinity == 0) {
        psVar33 = (secp256k1_context *)group;
        secp256k1_fe_mul(&psVar14[lVar41].x,(secp256k1_fe *)psVar14,(secp256k1_fe *)psVar33);
        secp256k1_fe_mul((secp256k1_fe *)psVar33,(secp256k1_fe *)psVar33,&local_1af0[lVar41].z);
        goto LAB_001122b8;
      }
      if (local_1af0[lVar41].infinity == 0) {
        puVar34 = psVar14[lVar41].x.n + 4;
        *(undefined4 *)puVar34 = (undefined4)group[0].x.n[4];
        *(undefined4 *)((long)puVar34 + 4) = group[0].x.n[4]._4_4_;
        *(int *)(puVar34 + 1) = group[0].x.magnitude;
        *(int *)((long)puVar34 + 0xc) = group[0].x.normalized;
        *(undefined1 (*) [16])(psVar14[lVar41].x.n + 2) = group[0].x.n._16_16_;
        psVar14[lVar41].x.n[0] = group[0].x.n[0];
        psVar14[lVar41].x.n[1] = group[0].x.n[1];
        lVar41 = 0;
        bVar47 = true;
        do {
          bVar23 = bVar47;
          if (local_1af0[lVar41].infinity == 0) {
            secp256k1_ge_set_gej_zinv(psVar14 + lVar41,local_1af0 + lVar41,&psVar14[lVar41].x);
          }
          lVar41 = 1;
          bVar47 = false;
        } while (bVar23);
        secp256k1_ge_verify(psVar14);
        secp256k1_ge_verify(psVar14 + 1);
LAB_00112349:
        lVar41 = 0;
        bVar47 = true;
LAB_0011235a:
        psVar16 = (secp256k1_context *)(psVar14 + lVar41);
        psVar33 = psVar16;
        secp256k1_ge_verify((secp256k1_ge *)psVar16);
        if (psVar14[lVar41].infinity == 0) goto code_r0x00112376;
        main_cold_4();
LAB_00114adc:
        main_cold_53();
LAB_00114ae1:
        main_cold_5();
LAB_00114ae6:
        main_cold_6();
LAB_00114aeb:
        main_cold_69();
LAB_00114af0:
        main_cold_68();
LAB_00114af5:
        main_cold_67();
LAB_00114afa:
        main_cold_7();
LAB_00114aff:
        main_cold_8();
LAB_00114b04:
        main_cold_61();
LAB_00114b09:
        main_cold_60();
LAB_00114b0e:
        main_cold_59();
LAB_00114b13:
        main_cold_58();
LAB_00114b18:
        main_cold_50();
LAB_00114b1d:
        main_cold_56();
        goto LAB_00114b22;
      }
    }
    main_cold_3();
LAB_00114b2c:
    main_cold_55();
LAB_00114b31:
    main_cold_54();
LAB_00114b36:
    main_cold_52();
LAB_00114b3b:
    main_cold_51();
    goto LAB_00114b40;
  }
  goto LAB_00114b54;
code_r0x00112376:
  secp256k1_ge_to_storage(secp256k1_ecmult_gen_prec_table[0] + lVar41,(secp256k1_ge *)psVar16);
  lVar41 = 1;
  bVar23 = !bVar47;
  bVar47 = false;
  if (bVar23) goto code_r0x00112398;
  goto LAB_0011235a;
LAB_00114a80:
  main_cold_64();
LAB_00114a85:
  main_cold_63();
LAB_00114a8a:
  main_cold_62();
  goto LAB_00114a9d;
code_r0x00112398:
  free(local_1af0);
  free(psVar15);
  free(psVar14);
  secp256k1_gej_set_ge(groupj,&secp256k1_ge_const_g);
  secp256k1_ecmult_compute_table(secp256k1_pre_g,(int)groupj,gen);
  iVar8 = 0x80;
  do {
    secp256k1_gej_double_var(groupj,groupj,(secp256k1_fe *)0x0);
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  secp256k1_ecmult_compute_table(secp256k1_pre_g_128,(int)groupj,gen_00);
  iVar8 = count;
  while( true ) {
    count = iVar8 + -1;
    if (iVar8 == 0) {
      testrand256(seed16);
      printf("random run = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
             seed16._0_8_ & 0xff,(ulong)seed16._0_8_ >> 8 & 0xff,(ulong)seed16._0_8_ >> 0x10 & 0xff,
             (ulong)seed16._0_8_ >> 0x18 & 0xff,(ulong)seed16._0_8_ >> 0x20 & 0xff,
             (ulong)seed16._0_8_ >> 0x28 & 0xff,(ulong)seed16._0_8_ >> 0x30 & 0xff,
             (ulong)seed16._0_8_ >> 0x38,seed16._8_8_ & 0xff,(ulong)seed16._8_8_ >> 8 & 0xff,
             (ulong)seed16._8_8_ >> 0x10 & 0xff,(ulong)seed16._8_8_ >> 0x18 & 0xff,
             (ulong)seed16._8_8_ >> 0x20 & 0xff,(ulong)seed16._8_8_ >> 0x28 & 0xff,
             (ulong)seed16._8_8_ >> 0x30 & 0xff,(ulong)seed16._8_8_ >> 0x38);
      puts("no problems found");
      return 0;
    }
    psVar16 = secp256k1_context_create(1);
    testrand256(rand32);
    psVar33 = psVar16;
    iVar8 = secp256k1_context_randomize(psVar16,rand32);
    if (iVar8 == 0) break;
    local_19f0 = psVar16;
    secp256k1_gej_set_infinity(groupj);
    secp256k1_ge_set_gej(group,groupj);
    lVar41 = -0x4e0;
    uVar24 = 1;
    psVar15 = groupj;
    do {
      psVar35 = psVar15 + 1;
      secp256k1_gej_add_ge(psVar35,psVar15,&secp256k1_ge_const_g);
      secp256k1_ge_set_gej((secp256k1_ge *)(auStack_7f0 + lVar41),psVar35);
      if (count != 0) {
        testutil_random_fe((secp256k1_fe *)seed16);
        secp256k1_gej_rescale(psVar35,(secp256k1_fe *)seed16);
      }
      scalar_i = uVar24;
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
      secp256k1_ecmult_gen(&psVar16->ecmult_gen_ctx,(secp256k1_gej *)seed16,&scalar_i);
      psVar33 = (secp256k1_context *)&generated;
      secp256k1_ge_set_gej((secp256k1_ge *)psVar33,(secp256k1_gej *)seed16);
      if (*(int *)((long)groupj[0].y.n + lVar41 + 0x28) != 0) goto LAB_00114ae1;
      if (generated.infinity != 0) goto LAB_00114ae6;
      psVar33 = (secp256k1_context *)&generated;
      iVar8 = secp256k1_fe_equal((secp256k1_fe *)psVar33,(secp256k1_fe *)(auStack_7f0 + lVar41));
      if (iVar8 == 0) goto LAB_00114aeb;
      psVar33 = (secp256k1_context *)&generated.y;
      iVar8 = secp256k1_fe_equal((secp256k1_fe *)psVar33,
                                 (secp256k1_fe *)((long)groupj[0].x.n + lVar41 + 0x28));
      if (iVar8 == 0) goto LAB_00114af0;
      uVar24 = uVar24 + 1;
      lVar41 = lVar41 + 0x68;
      psVar15 = psVar35;
    } while (lVar41 != 0);
    uVar12 = 0;
    psVar14 = group;
    lVar41 = 0;
    do {
      psVar33 = (secp256k1_context *)(psVar14 + (uVar12 / 0xd) * -0xd);
      secp256k1_ge_mul_lambda((secp256k1_ge *)seed16,(secp256k1_ge *)((long)group[0].x.n + lVar41));
      iVar8 = secp256k1_ge_eq_var((secp256k1_ge *)psVar33,(secp256k1_ge *)seed16);
      if (iVar8 == 0) goto LAB_00114af5;
      lVar41 = lVar41 + 0x68;
      psVar14 = psVar14 + 9;
      uVar12 = uVar12 + 9;
    } while (lVar41 != 0x548);
    psVar33 = (secp256k1_context *)group;
    secp256k1_ge_verify((secp256k1_ge *)psVar33);
    if (group[0].infinity == 0) goto LAB_00114b45;
    psVar33 = (secp256k1_context *)groupj;
    secp256k1_gej_verify((secp256k1_gej *)psVar33);
    if (groupj[0].infinity == 0) goto LAB_00114b4a;
    lVar41 = 0xc;
    psVar44 = (secp256k1_context *)(group + 1);
    a = (secp256k1_context *)(groupj + 1);
    do {
      psVar33 = psVar44;
      secp256k1_ge_verify((secp256k1_ge *)psVar44);
      if ((psVar44->ecmult_gen_ctx).ge_offset.y.magnitude != 0) goto LAB_00114afa;
      psVar33 = a;
      secp256k1_gej_verify((secp256k1_gej *)a);
      if ((int)(a->ecmult_gen_ctx).proj_blind.n[4] != 0) goto LAB_00114aff;
      a = (secp256k1_context *)&(a->ecmult_gen_ctx).proj_blind.magnitude;
      psVar44 = (secp256k1_context *)&(psVar44->ecmult_gen_ctx).ge_offset.infinity;
      lVar41 = lVar41 + -1;
    } while (lVar41 != 0);
    pFVar27 = (FILE *)group;
    local_1ae8 = (secp256k1_gej *)0x0;
    local_1ad0 = 0;
    do {
      if (((ulong)num_cores == 1) ||
         (local_1ad0 = local_1ad0 + 0xe7037ed1a0b428db,
         (uint32_t)((local_1ad0 >> 0x20 ^ local_1ad0 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
         this_core)) {
        secp256k1_fe_inv((secp256k1_fe *)&scalar_i,&groupj[(long)local_1ae8].z);
        lVar41 = 0;
        __stream = pFVar27;
        psVar15 = local_1ae8;
        do {
          psVar14 = (secp256k1_ge *)(((ulong)psVar15 / 0xd) * -0x548 + (long)__stream);
          psVar35 = (secp256k1_gej *)((long)groupj[0].x.n + lVar41);
          secp256k1_gej_add_var
                    ((secp256k1_gej *)seed16,psVar35,(secp256k1_gej *)&groupj[(long)local_1ae8].x,
                     (secp256k1_fe *)0x4ec4ec4ec4ec4ec5);
          iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)seed16,psVar14);
          if (iVar8 == 0) goto LAB_00114a80;
          if (local_1ae8 != (secp256k1_gej *)0x0) {
            secp256k1_gej_add_ge
                      ((secp256k1_gej *)seed16,psVar35,(secp256k1_ge *)&group[(long)local_1ae8].x);
            iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)seed16,psVar14);
            if (iVar8 == 0) {
              main_cold_9();
              goto LAB_00114ac5;
            }
          }
          secp256k1_gej_add_ge_var
                    ((secp256k1_gej *)seed16,psVar35,(secp256k1_ge *)&group[(long)local_1ae8].x,
                     (secp256k1_fe *)0x0);
          iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)seed16,psVar14);
          local_1af0 = psVar15;
          if (iVar8 == 0) goto LAB_00114a85;
          generated.infinity = groupj[(long)local_1ae8].infinity;
          uVar36 = groupj[(long)local_1ae8].x.n[1];
          uVar28 = groupj[(long)local_1ae8].x.n[3];
          uVar3._0_4_ = groupj[(long)local_1ae8].x.magnitude;
          uVar3._4_4_ = groupj[(long)local_1ae8].x.normalized;
          generated.x.n[4] = groupj[(long)local_1ae8].x.n[4];
          generated.x._40_7_ = SUB87(uVar3,0);
          generated.x.normalized._3_1_ = (undefined1)((uint)uVar3._4_4_ >> 0x18);
          generated.x.n[2] = groupj[(long)local_1ae8].x.n[2];
          generated.x.n[3]._0_7_ = (undefined7)uVar28;
          generated.x.n[3]._7_1_ = (undefined1)(uVar28 >> 0x38);
          generated.x.n[0] = groupj[(long)local_1ae8].x.n[0];
          generated.x.n[1]._0_7_ = (undefined7)uVar36;
          generated.x.n[1]._7_1_ = (undefined1)(uVar36 >> 0x38);
          generated.y.n[0] = groupj[(long)local_1ae8].y.n[0];
          uVar36 = groupj[(long)local_1ae8].y.n[1];
          generated.y.n._16_16_ = *(undefined1 (*) [16])(groupj[(long)local_1ae8].y.n + 2);
          generated.y.n[4]._0_4_ = (undefined4)groupj[(long)local_1ae8].y.n[4];
          generated.y.n[4]._4_4_ = *(undefined4 *)((long)groupj[(long)local_1ae8].y.n + 0x24);
          generated.y.magnitude = groupj[(long)local_1ae8].y.magnitude;
          generated.y.normalized = groupj[(long)local_1ae8].y.normalized;
          generated.y.n[1]._0_7_ = (undefined7)uVar36;
          generated.y.n[1]._7_1_ = (undefined1)(uVar36 >> 0x38);
          secp256k1_gej_add_zinv_var
                    ((secp256k1_gej *)seed16,psVar35,&generated,(secp256k1_fe *)&scalar_i);
          iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)seed16,psVar14);
          if (iVar8 == 0) goto LAB_00114a8a;
          lVar41 = lVar41 + 0x98;
          __stream = (FILE *)&__stream->_chain;
          psVar15 = (secp256k1_gej *)((long)(psVar15->x).n + 1);
        } while (lVar41 != 0x7b8);
      }
      local_1ae8 = (secp256k1_gej *)((long)(local_1ae8->x).n + 1);
      pFVar27 = (FILE *)&pFVar27->_chain;
    } while (local_1ae8 != (secp256k1_gej *)0xd);
    psVar15 = groupj;
    uVar24 = 0;
    uVar12 = 0;
    do {
      secp256k1_gej_double((secp256k1_gej *)seed16,psVar15);
      uVar19 = uVar24 - 0xd;
      if (uVar12 < 7) {
        uVar19 = uVar24;
      }
      psVar33 = (secp256k1_context *)seed16;
      iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)seed16,(secp256k1_ge *)&group[uVar19].x);
      if (iVar8 == 0) goto LAB_00114b04;
      secp256k1_gej_double_var((secp256k1_gej *)seed16,psVar15,(secp256k1_fe *)0x0);
      psVar33 = (secp256k1_context *)seed16;
      iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)seed16,(secp256k1_ge *)&group[uVar19].x);
      if (iVar8 == 0) goto LAB_00114b09;
      uVar12 = uVar12 + 1;
      uVar24 = uVar24 + 2;
      psVar15 = psVar15 + 1;
    } while (uVar12 != 0xd);
    lVar41 = 0x68;
    psVar14 = group + 0xc;
    psVar15 = groupj;
    do {
      psVar15 = psVar15 + 1;
      psVar33 = (secp256k1_context *)&generated;
      secp256k1_ge_neg((secp256k1_ge *)psVar33,(secp256k1_ge *)((long)group[0].x.n + lVar41));
      iVar8 = secp256k1_ge_eq_var((secp256k1_ge *)psVar33,psVar14);
      if (iVar8 == 0) goto LAB_00114b0e;
      secp256k1_gej_neg((secp256k1_gej *)seed16,psVar15);
      psVar33 = (secp256k1_context *)seed16;
      iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)seed16,psVar14);
      if (iVar8 == 0) goto LAB_00114b13;
      lVar41 = lVar41 + 0x68;
      psVar14 = psVar14 + -1;
    } while (lVar41 != 0x548);
    lVar41 = 1;
    local_1ad8 = (secp256k1_scalar *)0x68;
    local_1ad0 = 0;
    do {
      local_1af0 = (secp256k1_gej *)0x0;
      pFVar27 = (FILE *)group;
      do {
        if (((ulong)num_cores == 1) ||
           (local_1ad0 = local_1ad0 + 0xe7037ed1a0b428db,
           (uint32_t)((local_1ad0 >> 0x20 ^ local_1ad0 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
           this_core)) {
          uVar24 = 0;
          __stream = pFVar27;
          psVar15 = local_1af0;
          do {
            _na = CONCAT44(sStack_1a34,uVar24);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
            ng = (int)local_1af0;
            secp256k1_scalar_verify((secp256k1_scalar *)local_1af0);
            psStack_1aa0 = &generated;
            _ng_1 = (secp256k1_fe *)&scalar_i;
            local_1a98._0_8_ = seed16;
            na_00 = (code *)&na;
            secp256k1_ecmult_strauss_wnaf
                      ((secp256k1_strauss_state *)&ng_1,&tmp_3,1,(secp256k1_gej *)&groupj[lVar41].x,
                       (secp256k1_scalar *)na_00,&ng);
            iVar8 = secp256k1_gej_eq_ge_var
                              (&tmp_3,(secp256k1_ge *)
                                      (((ulong)psVar15 / 0xd) * -0x548 + (long)__stream));
            if (iVar8 == 0) {
              main_cold_57();
              goto LAB_00114a80;
            }
            uVar24 = uVar24 + 1;
            __stream = (FILE *)((long)&__stream->_flags + (long)local_1ad8);
            psVar15 = (secp256k1_gej *)((long)(psVar15->x).n + lVar41);
          } while (uVar24 != 0xd);
        }
        local_1af0 = (secp256k1_gej *)((long)(local_1af0->x).n + 1);
        pFVar27 = (FILE *)&pFVar27->_chain;
      } while ((int)local_1af0 != 0xd);
      lVar41 = lVar41 + 1;
      local_1ad8 = (secp256k1_scalar *)((long)local_1ad8 + 0x68);
    } while (lVar41 != 0xd);
    uVar12 = 0;
    do {
      lVar41 = 0;
      do {
        if (((ulong)num_cores == 1) ||
           (local_1ad0 = local_1ad0 + 0xe7037ed1a0b428db,
           (uint32_t)((local_1ad0 >> 0x20 ^ local_1ad0 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
           this_core)) {
          ng_1 = (int)uVar12;
          secp256k1_scalar_verify((secp256k1_scalar *)(uVar12 & 0xffffffff));
          psVar21 = &group[lVar41].x;
          secp256k1_ecmult_const((secp256k1_gej *)seed16,(secp256k1_ge *)psVar21,&ng_1);
          uVar24 = (int)lVar41 * (int)uVar12;
          b = &group[uVar24 - (uVar24 / 0xd + (uVar24 / 0xd) * 0xc)].x;
          psVar33 = (secp256k1_context *)seed16;
          iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)seed16,(secp256k1_ge *)b);
          if (iVar8 == 0) goto LAB_00114b1d;
          if (lVar41 != 0 && uVar12 != 0) {
            psVar33 = (secp256k1_context *)&tmp_3;
            iVar8 = secp256k1_ecmult_const_xonly
                              ((secp256k1_fe *)&tmp_3,psVar21,(secp256k1_fe *)0x0,&ng_1,0);
            if (iVar8 == 0) goto LAB_00114b2c;
            psVar33 = (secp256k1_context *)&tmp_3;
            iVar8 = secp256k1_fe_equal((secp256k1_fe *)&tmp_3,b);
            if (iVar8 == 0) goto LAB_00114b31;
            do {
              testutil_random_fe((secp256k1_fe *)&scalar_i);
              psVar33 = (secp256k1_context *)&scalar_i;
              secp256k1_fe_verify((secp256k1_fe *)&scalar_i);
              if (iStack_148c == 0) goto LAB_00114adc;
            } while ((SUB168(local_14a8 | _scalar_i,8) == 0 && SUB168(local_14a8 | _scalar_i,0) == 0
                     ) && CONCAT44(auStack_1494,local_1498) == 0);
            secp256k1_fe_mul(&generated.x,(secp256k1_fe *)&scalar_i,psVar21);
            na_00 = (code *)0x0;
            psVar33 = (secp256k1_context *)&tmp_3;
            iVar8 = secp256k1_ecmult_const_xonly
                              ((secp256k1_fe *)&tmp_3,&generated.x,(secp256k1_fe *)&scalar_i,&ng_1,0
                              );
            if (iVar8 == 0) goto LAB_00114b36;
            psVar33 = (secp256k1_context *)&tmp_3;
            iVar8 = secp256k1_fe_equal((secp256k1_fe *)&tmp_3,b);
            if (iVar8 == 0) goto LAB_00114b3b;
          }
        }
        lVar41 = lVar41 + 1;
      } while (lVar41 != 0xd);
      uVar12 = uVar12 + 1;
    } while (uVar12 != 0xd);
    psVar33 = (secp256k1_context *)malloc(0x1020);
    if (psVar33 == (secp256k1_context *)0x0) {
      (*(psVar16->error_callback).fn)("Out of memory",(psVar16->error_callback).data);
    }
    else {
      (psVar33->ecmult_gen_ctx).ge_offset.x.n[1] = 0;
      (psVar33->ecmult_gen_ctx).built = 0x61726373;
      (psVar33->ecmult_gen_ctx).scalar_offset = 0x686374;
      (psVar33->ecmult_gen_ctx).ge_offset.x.n[0] =
           (uint64_t)((psVar33->ecmult_gen_ctx).ge_offset.x.n + 3);
      (psVar33->ecmult_gen_ctx).ge_offset.x.n[2] = 0x1000;
    }
    local_19f0 = (secp256k1_context *)&local_19f0->error_callback;
    local_1a08 = (_func_void_char_ptr_void_ptr *)0x0;
    local_19e0 = 0;
    local_19d8 = psVar33;
    do {
      local_19f8 = (_func_void_char_ptr_void_ptr *)0x0;
      do {
        local_1a00 = (secp256k1_scalar *)0x0;
        do {
          uVar36 = 0;
          psVar44 = psVar33;
          do {
            if (((ulong)num_cores == 1) ||
               (local_19e0 = local_19e0 + 0xe7037ed1a0b428db, psVar33 = psVar44,
               (uint32_t)((local_19e0 >> 0x20 ^ local_19e0 & 0xffffffff) * (ulong)num_cores >> 0x20)
               == this_core)) {
              local_1998 = &group[uVar36].x;
              local_19a0 = (secp256k1_scalar *)(uVar36 * (long)local_1a08 + (long)local_1a00);
              uVar28 = 0;
              local_19a8 = uVar36;
              do {
                uVar32 = SUB84(local_1a08,0);
                seed16[0] = (char)uVar32;
                seed16[1] = (char)((uint)uVar32 >> 8);
                seed16[2] = (char)((uint)uVar32 >> 0x10);
                seed16[3] = (char)((uint)uVar32 >> 0x18);
                secp256k1_scalar_verify((secp256k1_scalar *)local_1a08);
                uVar32 = SUB84(local_19f8,0);
                seed16[4] = (char)uVar32;
                seed16[5] = (char)((uint)uVar32 >> 8);
                seed16[6] = (char)((uint)uVar32 >> 0x10);
                seed16[7] = (char)((uint)uVar32 >> 0x18);
                secp256k1_scalar_verify((secp256k1_scalar *)local_19f8);
                _na = CONCAT44(sStack_1a34,(int)local_1a00);
                secp256k1_scalar_verify(local_1a00);
                psVar21 = local_1998;
                puVar34 = (uint64_t *)(seed16 + 8);
                for (lVar41 = 0xd; lVar41 != 0; lVar41 = lVar41 + -1) {
                  *puVar34 = psVar21->n[0];
                  psVar21 = (secp256k1_fe *)((long)psVar21 + (ulong)bVar48 * -0x10 + 8);
                  puVar34 = puVar34 + (ulong)bVar48 * -2 + 1;
                }
                psVar21 = &group[uVar28].x;
                puVar34 = local_1148;
                for (pvVar22 = (void *)0xd; pvVar22 != (void *)0x0;
                    pvVar22 = (void *)((long)pvVar22 + -1)) {
                  *puVar34 = psVar21->n[0];
                  psVar21 = (secp256k1_fe *)((long)psVar21 + (ulong)bVar48 * -0x10 + 8);
                  puVar34 = puVar34 + (ulong)bVar48 * -2 + 1;
                }
                secp256k1_gej_set_infinity((secp256k1_gej *)&scalar_i);
                if (psVar44 == (secp256k1_context *)0x0) {
LAB_00113334:
                  secp256k1_ecmult_multi_simple_var
                            ((secp256k1_gej *)&scalar_i,&na,
                             (secp256k1_ecmult_multi_callback *)seed16,pvVar22,(size_t)na_00);
                }
                else {
                  lVar41 = 0;
                  do {
                    if (*(char *)((long)(psVar44->ecmult_gen_ctx).ge_offset.x.n + lVar41 + -8) !=
                        "scratch"[lVar41]) {
                      (*(psVar16->error_callback).fn)
                                ("invalid scratch space",(psVar16->error_callback).data);
                      uVar12 = 0;
                      goto LAB_00112f7d;
                    }
                    lVar41 = lVar41 + 1;
                  } while (lVar41 != 8);
                  uVar31 = (psVar44->ecmult_gen_ctx).ge_offset.x.n[2] -
                           (psVar44->ecmult_gen_ctx).ge_offset.x.n[1];
                  uVar12 = 0;
                  if (0x59 < uVar31) {
                    uVar12 = uVar31 - 0x5a;
                  }
LAB_00112f7d:
                  pvVar22 = (void *)0x1;
                  na_00 = (code *)&DAT_001225d0;
                  uVar31 = 0;
                  do {
                    if (pvVar22 == (void *)0xd) break;
                    if (pvVar22 < (void *)0xd) {
                      uVar36 = (((secp256k1_gej *)na_00)->x).n[0];
                    }
                    else {
                      uVar36 = 0;
                    }
                    uVar38 = (ulong)(byte)(0x7f / (byte)((byte)pvVar22 + 1));
                    uVar37 = (0x98L << ((byte)pvVar22 & 0x3f)) + uVar38 * 8 + 0x118;
                    if (uVar12 < uVar37) break;
                    uVar37 = (uVar12 - uVar37) / (uVar38 * 8 + 0x108);
                    uVar38 = uVar37;
                    if (uVar36 <= uVar37) {
                      uVar38 = uVar36;
                    }
                    if (uVar31 < uVar38) {
                      uVar31 = uVar38;
                    }
                    na_00 = (code *)((((secp256k1_gej *)na_00)->x).n + 1);
                    pvVar22 = (void *)((long)pvVar22 + 1);
                  } while (uVar36 <= uVar37);
                  if (uVar31 == 0) goto LAB_00113334;
                  lVar41 = 0;
                  do {
                    cVar2 = *(char *)((long)(psVar44->ecmult_gen_ctx).ge_offset.x.n + lVar41 + -8);
                    pvVar22 = (void *)CONCAT71((int7)((ulong)pvVar22 >> 8),cVar2);
                    if (cVar2 != "scratch"[lVar41]) {
                      (*(psVar16->error_callback).fn)
                                ("invalid scratch space",(psVar16->error_callback).data);
                      goto LAB_00113334;
                    }
                    lVar41 = lVar41 + 1;
                  } while (lVar41 != 8);
                  uVar12 = (psVar44->ecmult_gen_ctx).ge_offset.x.n[2] -
                           (psVar44->ecmult_gen_ctx).ge_offset.x.n[1];
                  pvVar22 = (void *)0x0;
                  if (0x4a < uVar12) {
                    pvVar22 = (void *)(uVar12 - 0x4b);
                  }
                  if (pvVar22 < (void *)0x70c) goto LAB_00113334;
                  local_1988 = (_func_void_char_ptr_void_ptr *)((long)pvVar22 - 0xe18);
                  local_1978 = (secp256k1_gej *)
                               (ulong)(local_1988 <
                                      (_func_void_char_ptr_void_ptr *)0xfffffffffffff8f4);
                  local_1980 = (undefined1 *)((long)(local_1978->x).n + 1);
                  puVar45 = (undefined1 *)0x2;
                  bVar5 = 0;
                  local_1ac8 = &na;
                  lVar41 = 0;
                  local_19d0 = uVar28;
                  do {
                    num = local_1980;
                    if (puVar45 < local_1980) {
                      num = puVar45;
                    }
                    lVar41 = lVar41 << ((byte)local_1978 & 0x3f);
                    lVar26 = 0;
                    psVar15 = local_1978;
                    do {
                      cVar2 = *(char *)((long)(psVar44->ecmult_gen_ctx).ge_offset.x.n + lVar26 + -8)
                      ;
                      psVar15 = (secp256k1_gej *)CONCAT71((int7)((ulong)psVar15 >> 8),cVar2);
                      if (cVar2 != "scratch"[lVar26]) {
                        (*(psVar16->error_callback).fn)
                                  ("invalid scratch space",(psVar16->error_callback).data);
                        local_1ab0 = 0;
                        psVar35 = (secp256k1_gej *)na_00;
                        goto LAB_001130f7;
                      }
                      lVar26 = lVar26 + 1;
                    } while (lVar26 != 8);
                    local_1ab0 = (psVar44->ecmult_gen_ctx).ge_offset.x.n[1];
                    psVar35 = (secp256k1_gej *)na_00;
LAB_001130f7:
                    secp256k1_gej_set_infinity((secp256k1_gej *)&generated);
                    psVar33 = local_19f0;
                    na_00 = (code *)psVar35;
                    if (puVar45 != (undefined1 *)0x0 || local_1ac8 != (secp256k1_scalar *)0x0) {
                      local_1ab8 = (secp256k1_gej *)
                                   secp256k1_scratch_alloc
                                             ((secp256k1_callback *)local_19f0,
                                              (secp256k1_scratch *)psVar44,(long)num * 0x98);
                      uVar32 = SUB84(psVar15,0);
                      local_1990 = (secp256k1_gej *)
                                   secp256k1_scratch_alloc
                                             ((secp256k1_callback *)psVar33,
                                              (secp256k1_scratch *)psVar44,(long)num * 4);
                      pvVar22 = secp256k1_scratch_alloc
                                          ((secp256k1_callback *)psVar33,
                                           (secp256k1_scratch *)psVar44,(long)num * 0xc0);
                      _ng_1 = (secp256k1_fe *)pvVar22;
                      pvVar17 = secp256k1_scratch_alloc
                                          ((secp256k1_callback *)psVar33,
                                           (secp256k1_scratch *)psVar44,(long)num * 0x1a0);
                      psStack_1aa0 = (secp256k1_ge *)pvVar17;
                      pvVar18 = secp256k1_scratch_alloc
                                          ((secp256k1_callback *)psVar33,
                                           (secp256k1_scratch *)psVar44,(long)num * 0x410);
                      na_00 = (code *)local_1990;
                      psVar44 = local_19d8;
                      local_1a98._0_8_ = pvVar18;
                      auVar49._0_4_ =
                           -(uint)((int)local_1ab8 == 0 && (int)((ulong)local_1ab8 >> 0x20) == 0);
                      auVar49._4_4_ =
                           -(uint)((int)local_1990 == 0 && (int)((ulong)local_1990 >> 0x20) == 0);
                      auVar49._8_4_ =
                           -(uint)((int)pvVar22 == 0 && (int)((ulong)pvVar22 >> 0x20) == 0);
                      auVar49._12_4_ =
                           -(uint)((int)pvVar17 == 0 && (int)((ulong)pvVar17 >> 0x20) == 0);
                      iVar8 = movmskps(uVar32,auVar49);
                      if ((iVar8 != 0) || (pvVar18 == (void *)0x0)) {
                        secp256k1_scratch_apply_checkpoint
                                  ((secp256k1_callback *)local_19f0,(secp256k1_scratch *)local_19d8,
                                   local_1ab0);
                        uVar28 = local_19d0;
                        na_00 = (code *)psVar35;
                        break;
                      }
                      if (puVar45 != (undefined1 *)0x0) {
                        puVar34 = (uint64_t *)(seed16 + lVar41 * 0x68 + 8);
                        puVar46 = (undefined1 *)0x0;
                        psVar15 = local_1ab8;
                        do {
                          *(undefined4 *)((long)(((secp256k1_gej *)na_00)->x).n + (long)puVar46 * 4)
                               = *(undefined4 *)(seed16 + (long)puVar46 * 4 + lVar41 * 4);
                          puVar30 = puVar34;
                          psVar35 = &tmp_3;
                          for (lVar26 = 0xd; lVar26 != 0; lVar26 = lVar26 + -1) {
                            (psVar35->x).n[0] = *puVar30;
                            puVar30 = puVar30 + (ulong)bVar48 * -2 + 1;
                            psVar35 = (secp256k1_gej *)((long)psVar35 + (ulong)bVar48 * -0x10 + 8);
                          }
                          secp256k1_gej_set_ge(psVar15,(secp256k1_ge *)&tmp_3);
                          puVar46 = puVar46 + 1;
                          psVar15 = psVar15 + 1;
                          puVar34 = puVar34 + 0xd;
                        } while (num != puVar46);
                      }
                      psVar15 = local_1ab8;
                      secp256k1_ecmult_strauss_wnaf
                                ((secp256k1_strauss_state *)&ng_1,(secp256k1_gej *)&generated,
                                 (size_t)num,local_1ab8,(secp256k1_scalar *)na_00,local_1ac8);
                      psVar44 = local_19d8;
                      secp256k1_scratch_apply_checkpoint
                                ((secp256k1_callback *)local_19f0,(secp256k1_scratch *)local_19d8,
                                 local_1ab0);
                    }
                    bVar47 = (_func_void_char_ptr_void_ptr *)0xfffffffffffff8f3 < local_1988;
                    secp256k1_gej_add_var
                              ((secp256k1_gej *)&scalar_i,(secp256k1_gej *)&scalar_i,
                               (secp256k1_gej *)&generated,&psVar15->x);
                    puVar45 = puVar45 + -(long)num;
                    bVar7 = bVar5 ^ 1;
                    lVar41 = 1;
                    local_1ac8 = (secp256k1_scalar *)0x0;
                    bVar5 = 1;
                    uVar28 = local_19d0;
                  } while ((bool)(bVar47 & bVar7));
                }
                psVar33 = (secp256k1_context *)&scalar_i;
                uVar24 = (int)uVar28 * (int)local_19f8 + (int)local_19a0;
                iVar8 = secp256k1_gej_eq_ge_var
                                  ((secp256k1_gej *)psVar33,
                                   (secp256k1_ge *)
                                   &group[uVar24 - (uVar24 / 0xd + (uVar24 / 0xd) * 0xc)].x);
                if (iVar8 == 0) goto LAB_00114b18;
                uVar28 = uVar28 + 1;
                uVar36 = local_19a8;
                psVar33 = psVar44;
              } while (uVar28 != 0xd);
            }
            uVar36 = uVar36 + 1;
            psVar44 = psVar33;
          } while (uVar36 != 0xd);
          local_1a00 = (secp256k1_scalar *)((long)local_1a00 + 1);
        } while (local_1a00 != (secp256k1_scalar *)0xd);
        local_19f8 = local_19f8 + 1;
      } while (local_19f8 != (_func_void_char_ptr_void_ptr *)0xd);
      local_1a08 = local_1a08 + 1;
    } while (local_1a08 != (_func_void_char_ptr_void_ptr *)0xd);
    if (psVar33 != (secp256k1_context *)0x0) {
      lVar41 = 0;
      do {
        if (*(char *)((long)(psVar33->ecmult_gen_ctx).ge_offset.x.n + lVar41 + -8) !=
            "scratch"[lVar41]) {
          (*(psVar16->error_callback).fn)("invalid scratch space",(psVar16->error_callback).data);
          goto LAB_0011348c;
        }
        lVar41 = lVar41 + 1;
      } while (lVar41 != 8);
      if ((psVar33->ecmult_gen_ctx).ge_offset.x.n[1] != 0) goto LAB_00114b72;
      free(psVar33);
    }
LAB_0011348c:
    psVar42 = (secp256k1_scalar *)0x1;
    uVar12 = 0;
    do {
      r_00 = (secp256k1_scalar *)0x1;
      do {
        if (((ulong)num_cores == 1) ||
           (uVar12 = uVar12 + 0xe7037ed1a0b428db,
           (uint32_t)((uVar12 >> 0x20 ^ uVar12 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
           this_core)) {
          tmp_3.x.n[0]._0_4_ = 1;
          iVar8 = 1;
          do {
            secp256k1_scalar_verify(psVar42);
            secp256k1_scalar_verify(r_00);
            secp256k1_scalar_verify(r_00);
            generated.x.n[2] = 0;
            generated.x.n[3]._0_7_ = 0;
            generated.x.n[0] = 0;
            generated.x.n[1]._0_7_ = 0;
            generated.x.n[1]._7_1_ = 0;
            generated.x.n[3]._7_1_ = SUB81(r_00,0);
            secp256k1_scalar_verify(psVar42);
            _scalar_i = (undefined1  [16])0x0;
            local_14a8._0_15_ = SUB1615((undefined1  [16])0x0,0);
            local_14a8[0xf] = (char)psVar42;
            na_00 = secp256k1_nonce_function_smallint;
            psVar33 = psVar16;
            iVar9 = secp256k1_ecdsa_sign
                              (psVar16,(secp256k1_ecdsa_signature *)seed16,(uchar *)&scalar_i,
                               (uchar *)&generated,secp256k1_nonce_function_smallint,&tmp_3);
            if (iVar9 != 1) goto LAB_00114b5e;
            lVar41 = 0;
            uVar24 = 0;
            do {
              uVar19 = (uint)seed16[lVar41] | uVar24 << 8;
              uVar24 = uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc);
              if (uVar19 < 0xd) {
                uVar24 = uVar19;
              }
              lVar41 = lVar41 + 1;
            } while (lVar41 != 0x20);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
            uVar19 = 0;
            lVar41 = 0x20;
            do {
              uVar20 = (uint)seed16[lVar41] | uVar19 << 8;
              uVar19 = uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc);
              if (uVar20 < 0xd) {
                uVar19 = uVar20;
              }
              lVar41 = lVar41 + 1;
            } while (lVar41 != 0x40);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
            psVar33 = (secp256k1_context *)&ng_1;
            r_from_k((secp256k1_scalar *)psVar33,group,(int)tmp_3.x.n[0],(int *)0x0);
            if (uVar24 != ng_1) goto LAB_00114b63;
            iVar9 = (int)tmp_3.x.n[0];
            uVar20 = (int)tmp_3.x.n[0] * uVar19;
            uVar24 = uVar24 * (int)r_00 + (int)psVar42;
            iVar39 = uVar24 - (uVar24 / 0xd + (uVar24 / 0xd) * 0xc);
            if ((uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc) != iVar39) &&
               (uVar24 = (0xd - uVar19) * (int)tmp_3.x.n[0],
               uVar24 - (uVar24 / 0xd + (uVar24 / 0xd) * 0xc) != iVar39)) goto LAB_00114b68;
            if ((int)tmp_3.x.n[0] < iVar8) break;
            iVar8 = (int)tmp_3.x.n[0] + 1;
            tmp_3.x.n[0]._0_4_ = iVar8;
          } while (iVar9 < 0xc);
        }
        uVar24 = (int)r_00 + 1;
        r_00 = (secp256k1_scalar *)(ulong)uVar24;
      } while (uVar24 != 0xd);
      uVar24 = (int)psVar42 + 1;
      psVar42 = (secp256k1_scalar *)(ulong)uVar24;
    } while (uVar24 != 0xd);
    uVar24 = 1;
    local_1ab8 = (secp256k1_gej *)0x0;
    uVar10 = num_cores;
    do {
      local_1af0 = (secp256k1_gej *)0x1;
      do {
        uVar19 = 1;
        do {
          local_1ae8 = (secp256k1_gej *)0x1;
          do {
            if ((uVar10 == 1) ||
               (local_1ab8 = (secp256k1_gej *)((long)local_1ab8[-0x2a150f76858d35].y.n + 0x23),
               (uint32_t)
               ((ulong)uVar10 * ((ulong)local_1ab8 >> 0x20 ^ (ulong)local_1ab8 & 0xffffffff) >> 0x20
               ) == this_core)) {
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)local_1af0 & 0xffffffff));
              ng_1 = uVar19;
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)local_1ae8 & 0xffffffff));
              uVar40 = (int)local_1af0 * (int)local_1ae8;
              uVar40 = uVar40 - (uVar40 / 0xd + (uVar40 / 0xd) * 0xc);
              uVar12 = 0;
              uVar20 = 0;
              uVar29 = 0;
              do {
                r_from_k((secp256k1_scalar *)seed16,group,uVar29,(int *)0x0);
                if (local_1af0 == (secp256k1_gej *)(seed16._0_8_ & 0xffffffff)) {
                  uVar43 = (int)uVar12 - ((int)(uVar12 / 0xd) + (int)(uVar12 / 0xd) * 0xc);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar29);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar29);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar43);
                  secp256k1_scalar_verify((secp256k1_scalar *)((ulong)local_1af0 & 0xffffffff));
                  secp256k1_scalar_verify((secp256k1_scalar *)local_1ae8);
                  _na = CONCAT44(sStack_1a34,uVar40);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar40);
                  secp256k1_scalar_add(&na,&na,&ng_1);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar43);
                  sVar6 = na;
                  secp256k1_scalar_verify((secp256k1_scalar *)(_na & 0xffffffff));
                  uVar20 = uVar20 | uVar43 == sVar6;
                }
                uVar29 = uVar29 + 1;
                uVar12 = (ulong)((int)uVar12 + uVar24);
              } while (uVar29 != 0xd);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)local_1af0 & 0xffffffff));
              generated.x.n[2] = 0;
              generated.x.n[3]._0_7_ = 0;
              generated.x.n[0] = 0;
              generated.x.n[1]._0_7_ = 0;
              generated.x.n[1]._7_1_ = 0;
              generated.x.n[3]._7_1_ = SUB81(local_1af0,0);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
              generated.y.n[0] = 0;
              generated.y.n[1]._0_7_ = 0;
              generated.x.n[4] = 0;
              generated.x._40_7_ = 0;
              generated.x.normalized._3_1_ = 0;
              generated.y.n[1]._7_1_ = (char)uVar24;
              psVar21 = &group[(long)local_1ae8].x;
              psVar14 = (secp256k1_ge *)seed16;
              for (lVar41 = 0xd; lVar41 != 0; lVar41 = lVar41 + -1) {
                (psVar14->x).n[0] = psVar21->n[0];
                psVar21 = (secp256k1_fe *)((long)psVar21 + (ulong)bVar48 * -0x10 + 8);
                psVar14 = (secp256k1_ge *)((long)psVar14 + (ulong)bVar48 * -0x10 + 8);
              }
              secp256k1_pubkey_save((secp256k1_pubkey *)&scalar_i,(secp256k1_ge *)seed16);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
              tmp_3.x.n[0] = 0;
              tmp_3.x.n[1] = 0;
              tmp_3.x.n._16_15_ = SUB1615((undefined1  [16])0x0,0);
              tmp_3.x.n[3]._7_1_ = (char)uVar19;
              psVar33 = psVar16;
              uVar29 = secp256k1_ecdsa_verify
                                 (psVar16,(secp256k1_ecdsa_signature *)&generated,(uchar *)&tmp_3,
                                  (secp256k1_pubkey *)&scalar_i);
              uVar10 = num_cores;
              if ((uVar24 < 7 & uVar20) != uVar29) goto LAB_00114b6d;
            }
            local_1ae8 = (secp256k1_gej *)((long)local_1ae8 + 1);
          } while (local_1ae8 != (secp256k1_gej *)0xd);
          uVar19 = uVar19 + 1;
        } while (uVar19 != 0xd);
        local_1af0 = (secp256k1_gej *)((long)local_1af0 + 1);
      } while (local_1af0 != (secp256k1_gej *)0xd);
      uVar24 = uVar24 + 1;
    } while (uVar24 != 0xd);
    uVar24 = 1;
    local_1ad8 = (secp256k1_scalar *)0x0;
    do {
      psVar42 = (secp256k1_scalar *)0x1;
      do {
        iVar8 = (int)psVar42;
        if (((ulong)num_cores == 1) ||
           (local_1ad8 = (secp256k1_scalar *)((long)local_1ad8 + 0xe7037ed1a0b428db),
           (uint32_t)
           (((ulong)local_1ad8 >> 0x20 ^ (ulong)local_1ad8 & 0xffffffff) * (ulong)num_cores >> 0x20)
           == this_core)) {
          _na = CONCAT44(sStack_1a34,1);
          iVar9 = 1;
          do {
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
            secp256k1_scalar_verify(psVar42);
            secp256k1_scalar_verify(psVar42);
            tmp_3.x.n[0] = 0;
            tmp_3.x.n[1] = 0;
            tmp_3.x.n._16_15_ = SUB1615((undefined1  [16])0x0,0);
            tmp_3.x.n[3]._7_1_ = (char)psVar42;
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
            _ng_1 = (undefined1  [16])0x0;
            local_1a98._0_15_ = SUB1615((undefined1  [16])0x0,0);
            local_1a98[0xf] = (char)uVar24;
            na_00 = secp256k1_nonce_function_smallint;
            secp256k1_ecdsa_sign_recoverable
                      (psVar16,(secp256k1_ecdsa_recoverable_signature *)seed16,(uchar *)&ng_1,
                       (uchar *)&tmp_3,secp256k1_nonce_function_smallint,&na);
            lVar41 = 0;
            uVar19 = 0;
            do {
              uVar20 = (uint)seed16[lVar41] | uVar19 << 8;
              uVar19 = uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc);
              if (uVar20 < 0xd) {
                uVar19 = uVar20;
              }
              lVar41 = lVar41 + 1;
            } while (lVar41 != 0x20);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
            uVar20 = 0;
            lVar41 = 0x20;
            do {
              uVar29 = (uint)seed16[lVar41] | uVar20 << 8;
              uVar20 = uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc);
              if (uVar29 < 0xd) {
                uVar20 = uVar29;
              }
              lVar41 = lVar41 + 1;
            } while (lVar41 != 0x40);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar20);
            psVar33 = (secp256k1_context *)&ng;
            r_from_k((secp256k1_scalar *)psVar33,group,na,(int *)&local_19c8);
            if (uVar19 != ng) goto LAB_00114b77;
            lVar41 = (long)(int)na;
            uVar29 = na * uVar20;
            uVar19 = uVar19 * iVar8 + uVar24;
            iVar39 = uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc);
            if ((uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc) != iVar39) &&
               (uVar19 = (0xd - uVar20) * na,
               uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc) != iVar39)) goto LAB_00114b7c;
            uVar19 = (uint)((uint)local_19c8.fn != 0) * 2;
            local_1498 = *(uchar (*) [4])(group[lVar41].y.n + 4);
            auStack_1494 = *(uchar (*) [4])((long)group[lVar41].y.n + 0x24);
            iStack_1490 = group[lVar41].y.magnitude;
            iStack_148c = group[lVar41].y.normalized;
            uStack_14b0 = group[lVar41].y.n[1];
            _scalar_i = group[lVar41].y.n[0];
            local_14a8._8_8_ = group[lVar41].y.n[3];
            local_14a8._0_8_ = group[lVar41].y.n[2];
            psVar33 = (secp256k1_context *)&scalar_i;
            secp256k1_fe_normalize((secp256k1_fe *)psVar33);
            uVar20 = uVar20 * na;
            secp256k1_fe_verify((secp256k1_fe *)psVar33);
            if (uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc) == iVar39) {
              if (iStack_148c == 0) goto LAB_00114b81;
              uVar19 = scalar_i & 1 | uVar19;
            }
            else {
              if (iStack_148c == 0) goto LAB_00114b86;
              uVar19 = (scalar_i & 1 | uVar19) ^ 1;
            }
            if (uVar19 != local_1178) goto LAB_00114b8b;
            secp256k1_ecdsa_recoverable_signature_convert
                      (psVar16,(secp256k1_ecdsa_signature *)&generated,
                       (secp256k1_ecdsa_recoverable_signature *)seed16);
            lVar41 = 0;
            uVar19 = 0;
            do {
              uVar20 = (uint)*(byte *)((long)generated.x.n + lVar41) | uVar19 << 8;
              uVar19 = uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc);
              if (uVar20 < 0xd) {
                uVar19 = uVar20;
              }
              lVar41 = lVar41 + 1;
            } while (lVar41 != 0x20);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
            uVar20 = 0;
            lVar41 = 0x20;
            do {
              uVar29 = (uint)*(byte *)((long)generated.x.n + lVar41) | uVar20 << 8;
              uVar20 = uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc);
              if (uVar29 < 0xd) {
                uVar20 = uVar29;
              }
              lVar41 = lVar41 + 1;
            } while (lVar41 != 0x40);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar20);
            psVar33 = (secp256k1_context *)&ng;
            r_from_k((secp256k1_scalar *)psVar33,group,na,(int *)0x0);
            if (uVar19 != ng) goto LAB_00114b90;
            sVar6 = na;
            uVar29 = na * uVar20;
            uVar19 = uVar19 * iVar8 + uVar24;
            iVar39 = uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc);
            if ((uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc) != iVar39) &&
               (uVar19 = (0xd - uVar20) * na,
               uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc) != iVar39)) goto LAB_00114b95;
            if ((int)na < iVar9) break;
            iVar9 = na + 1;
            _na = CONCAT44(sStack_1a34,iVar9);
          } while ((int)sVar6 < 0xc);
        }
        psVar42 = (secp256k1_scalar *)(ulong)(iVar8 + 1U);
      } while (iVar8 + 1U != 0xd);
      uVar24 = uVar24 + 1;
    } while (uVar24 != 0xd);
    uVar24 = 1;
    local_1ac8 = (secp256k1_scalar *)0x0;
    uVar10 = num_cores;
    do {
      local_1af0 = (secp256k1_gej *)0x1;
      do {
        uVar19 = 1;
        do {
          local_1ad8 = (secp256k1_scalar *)0x1;
          do {
            if ((uVar10 == 1) ||
               (local_1ac8 = (secp256k1_scalar *)((long)local_1ac8 + 0xe7037ed1a0b428db),
               (uint32_t)
               ((ulong)uVar10 * ((ulong)local_1ac8 >> 0x20 ^ (ulong)local_1ac8 & 0xffffffff) >> 0x20
               ) == this_core)) {
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)local_1af0 & 0xffffffff));
              _na = CONCAT44(sStack_1a34,uVar19);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)local_1ad8 & 0xffffffff));
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
              _ng_1 = (undefined1  [16])0x0;
              local_1a98._0_15_ = SUB1615((undefined1  [16])0x0,0);
              local_1a98[0xf] = (char)uVar19;
              uVar40 = (int)local_1af0 * (int)local_1ad8;
              uVar40 = uVar40 - (uVar40 / 0xd + (uVar40 / 0xd) * 0xc);
              uVar12 = 0;
              uVar20 = 0;
              uVar29 = 0;
              do {
                r_from_k((secp256k1_scalar *)seed16,group,uVar29,(int *)0x0);
                if (local_1af0 == (secp256k1_gej *)(seed16._0_8_ & 0xffffffff)) {
                  uVar43 = (int)uVar12 - ((int)(uVar12 / 0xd) + (int)(uVar12 / 0xd) * 0xc);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar29);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar29);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar43);
                  secp256k1_scalar_verify((secp256k1_scalar *)local_1af0);
                  secp256k1_scalar_verify(local_1ad8);
                  ng = uVar40;
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar40);
                  secp256k1_scalar_add(&ng,&ng,&na);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar43);
                  sVar6 = ng;
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)ng);
                  uVar20 = uVar20 | uVar43 == sVar6;
                }
                uVar29 = uVar29 + 1;
                uVar12 = (ulong)((int)uVar12 + uVar24);
              } while (uVar29 != 0xd);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)local_1af0 & 0xffffffff));
              generated.x.n[2] = 0;
              generated.x.n[3]._0_7_ = 0;
              generated.x.n[0] = 0;
              generated.x.n[1]._0_7_ = 0;
              generated.x.n[1]._7_1_ = 0;
              generated.x.n[3]._7_1_ = SUB81(local_1af0,0);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
              generated.y.n[0] = 0;
              generated.y.n[1]._0_7_ = 0;
              generated.x.n[4] = 0;
              generated.x._40_7_ = 0;
              generated.x.normalized._3_1_ = 0;
              generated.y.n[1]._7_1_ = (undefined1)uVar24;
              auVar4[0xf] = 0;
              auVar4._0_15_ = (undefined1  [15])generated.y.n._17_15_;
              generated.y.n._16_16_ = auVar4 << 8;
              secp256k1_ecdsa_recoverable_signature_convert
                        (psVar16,(secp256k1_ecdsa_signature *)&scalar_i,
                         (secp256k1_ecdsa_recoverable_signature *)&generated);
              psVar21 = &group[(long)local_1ad8].x;
              psVar14 = (secp256k1_ge *)seed16;
              for (lVar41 = 0xd; lVar41 != 0; lVar41 = lVar41 + -1) {
                (psVar14->x).n[0] = psVar21->n[0];
                psVar21 = (secp256k1_fe *)((long)psVar21 + (ulong)bVar48 * -0x10 + 8);
                psVar14 = (secp256k1_ge *)((long)psVar14 + (ulong)bVar48 * -0x10 + 8);
              }
              secp256k1_pubkey_save((secp256k1_pubkey *)&tmp_3,(secp256k1_ge *)seed16);
              psVar33 = psVar16;
              uVar29 = secp256k1_ecdsa_verify
                                 (psVar16,(secp256k1_ecdsa_signature *)&scalar_i,(uchar *)&ng_1,
                                  (secp256k1_pubkey *)&tmp_3);
              uVar10 = num_cores;
              if ((uVar24 < 7 & uVar20) != uVar29) goto LAB_00114b9a;
            }
            local_1ad8 = (secp256k1_scalar *)((long)local_1ad8 + 1);
          } while (local_1ad8 != (secp256k1_scalar *)0xd);
          uVar19 = uVar19 + 1;
        } while (uVar19 != 0xd);
        local_1af0 = (secp256k1_gej *)((long)local_1af0 + 1);
      } while (local_1af0 != (secp256k1_gej *)0xd);
      uVar24 = uVar24 + 1;
    } while (uVar24 != 0xd);
    uVar12 = 1;
    puVar45 = local_17f8;
    psVar15 = &tmp_3;
    do {
      secp256k1_scalar_verify((secp256k1_scalar *)(uVar12 & 0xffffffff));
      secp256k1_scalar_verify((secp256k1_scalar *)(uVar12 & 0xffffffff));
      _ng = (undefined1  [16])0x0;
      local_1a58._0_15_ = SUB1615((undefined1  [16])0x0,0);
      local_1a58[0xf] = (char)uVar12;
      psVar33 = psVar16;
      iVar8 = secp256k1_keypair_create
                        (psVar16,(secp256k1_keypair *)(seed16 + (uVar12 - 1) * 0x60),(uchar *)&ng);
      if (iVar8 == 0) goto LAB_00114b9f;
      pubkey_00 = (secp256k1_pubkey *)((long)&generated.x + uVar12 * 0x40 + -0x40);
      psVar33 = psVar16;
      iVar8 = secp256k1_ec_pubkey_create(psVar16,pubkey_00,(uchar *)&ng);
      if (iVar8 == 0) goto LAB_00114ba4;
      pubkey = &sStack_14f8 + uVar12;
      pk_parity = &ng_1 + (uVar12 - 1);
      psVar33 = psVar16;
      iVar8 = secp256k1_keypair_xonly_pub
                        (psVar16,pubkey,(int *)pk_parity,
                         (secp256k1_keypair *)(seed16 + (uVar12 - 1) * 0x60));
      if (iVar8 == 0) goto LAB_00114ba9;
      puVar34 = tmp_3.x.n + uVar12 * 4 + -4;
      psVar33 = psVar16;
      iVar8 = secp256k1_xonly_pubkey_serialize(psVar16,(uchar *)puVar34,pubkey);
      if (iVar8 == 0) goto LAB_00114bae;
      psVar33 = psVar16;
      iVar8 = secp256k1_xonly_pubkey_parse(psVar16,pubkey,(uchar *)puVar34);
      if (iVar8 == 0) goto LAB_00114bb3;
      psVar33 = psVar16;
      iVar8 = secp256k1_xonly_pubkey_serialize(psVar16,(uchar *)&ng,pubkey);
      if (iVar8 == 0) goto LAB_00114bb8;
      lVar41 = 0;
      do {
        if (*(char *)((long)(psVar15->x).n + lVar41) != *(char *)((long)&ng + lVar41))
        goto LAB_00114bbd;
        lVar41 = lVar41 + 1;
      } while (lVar41 != 0x20);
      psVar33 = psVar16;
      iVar8 = secp256k1_xonly_pubkey_from_pubkey(psVar16,pubkey,(int *)&local_19c8,pubkey_00);
      if (iVar8 == 0) goto LAB_00114bc2;
      if ((uint)local_19c8.fn != *pk_parity) goto LAB_00114bc7;
      psVar33 = psVar16;
      iVar8 = secp256k1_xonly_pubkey_serialize(psVar16,(uchar *)&ng,pubkey);
      if (iVar8 == 0) goto LAB_00114bcc;
      lVar41 = 0;
      do {
        if (*(char *)((long)(psVar15->x).n + lVar41) != *(char *)((long)&ng + lVar41))
        goto LAB_00114bd1;
        lVar41 = lVar41 + 1;
      } while (lVar41 != 0x20);
      psVar33 = (secp256k1_context *)&na;
      secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)psVar33,(uchar *)puVar34);
      uStack_1a10 = 1;
      secp256k1_fe_verify((secp256k1_fe *)psVar33);
      iVar8 = secp256k1_fe_equal((secp256k1_fe *)psVar33,&group[uVar12].x);
      if (iVar8 == 0) goto LAB_00114bd6;
      _na = group[uVar12].y.n[0];
      uStack_1a30 = group[uVar12].y.n[1];
      local_1a28 = group[uVar12].y.n[2];
      uStack_1a20 = group[uVar12].y.n[3];
      local_1a18 = (undefined4)group[uVar12].y.n[4];
      uStack_1a14 = *(undefined4 *)((long)group[uVar12].y.n + 0x24);
      uStack_1a10 = CONCAT44(group[uVar12].y.normalized,group[uVar12].y.magnitude);
      psVar33 = (secp256k1_context *)&na;
      secp256k1_fe_normalize_var((secp256k1_fe *)psVar33);
      secp256k1_fe_verify((secp256k1_fe *)psVar33);
      if (uStack_1a10._4_4_ == 0) goto LAB_00114bdb;
      if ((na & 1) != *pk_parity) goto LAB_00114be0;
      if (6 < uVar12) {
        lVar41 = 0;
        do {
          if (*(char *)((long)(psVar15->x).n + lVar41) != puVar45[lVar41]) goto LAB_00114be5;
          lVar41 = lVar41 + 1;
        } while (lVar41 != 0x20);
        if ((na & 1) != 1 - (&ng_1)[0xc - uVar12]) goto LAB_00114bea;
      }
      uVar12 = uVar12 + 1;
      psVar15 = (secp256k1_gej *)((psVar15->x).n + 4);
      puVar45 = puVar45 + -0x20;
    } while (uVar12 != 0xd);
    lVar41 = 0;
    do {
      psVar33 = psVar16;
      iVar8 = secp256k1_xonly_pubkey_parse
                        (psVar16,(secp256k1_xonly_pubkey *)seed16,invalid_pubkey_bytes[0] + lVar41);
      if (iVar8 != 0) goto LAB_00114bef;
      lVar41 = lVar41 + 0x20;
    } while (lVar41 != 0xe0);
    uVar24 = 1;
    keypair = (secp256k1_keypair *)seed16;
    psVar14 = &generated;
    psVar42 = &scalar_i;
    lVar41 = 0;
    do {
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
      tmp_3.x.n[0] = 0;
      tmp_3.x.n[1] = 0;
      tmp_3.x.n._16_15_ = SUB1615((undefined1  [16])0x0,0);
      tmp_3.x.n[3]._7_1_ = (char)uVar24;
      psVar33 = psVar16;
      iVar8 = secp256k1_keypair_create(psVar16,keypair,(uchar *)&tmp_3);
      if (iVar8 == 0) goto LAB_00114bf4;
      psVar33 = psVar16;
      iVar8 = secp256k1_keypair_xonly_pub
                        (psVar16,(secp256k1_xonly_pubkey *)psVar14,(int *)((long)&na + lVar41),
                         keypair);
      if (iVar8 == 0) goto LAB_00114bf9;
      psVar33 = psVar16;
      iVar8 = secp256k1_xonly_pubkey_serialize
                        (psVar16,(uchar *)psVar42,(secp256k1_xonly_pubkey *)psVar14);
      if (iVar8 == 0) goto LAB_00114bfe;
      lVar41 = lVar41 + 4;
      psVar42 = psVar42 + 8;
      psVar14 = (secp256k1_ge *)((psVar14->y).n + 2);
      keypair = keypair + 1;
      uVar24 = uVar24 + 1;
    } while (lVar41 != 0x30);
    _e_1 = 0x8cb36fda;
    local_1ae8 = (secp256k1_gej *)0x1;
    local_1ad8 = (secp256k1_scalar *)0x0;
    do {
      iVar8 = 0xd - (int)local_1ae8;
      if ((&iStack_1a3c)[(long)local_1ae8] == 0) {
        iVar8 = (int)local_1ae8;
      }
      local_1abc = 1;
      do {
        local_1a88 = (undefined1  [16])0x0;
        local_1a98 = (undefined1  [16])0x0;
        _ng_1 = (undefined1  [16])0x0;
        local_1a78 = 0;
        if (((ulong)num_cores == 1) ||
           (local_1ad8 = (secp256k1_scalar *)((long)local_1ad8 + 0xe7037ed1a0b428db),
           (uint32_t)
           (((ulong)local_1ad8 >> 0x20 ^ (ulong)local_1ad8 & 0xffffffff) * (ulong)num_cores >> 0x20)
           == this_core)) {
          local_1968 = secp256k1_hardened_nonce_function_smallint;
          local_1960 = &local_1abc;
          iVar9 = 0xd - local_1abc;
          if ((&iStack_1a3c)[local_1abc] == 0) {
            iVar9 = local_1abc;
          }
          iVar39 = 0;
          do {
            testrand256((uchar *)&ng);
            na_00 = (code *)(&scalar_i + ((long)local_1ae8 + -1) * 8);
            secp256k1_schnorrsig_challenge
                      (&e,sStack_14f8.data + (long)local_1abc * 0x20 + 0x20,(uchar *)&ng,0x20,
                       (uchar *)(&scalar_i + ((long)local_1ae8 + -1) * 8));
            uVar12 = (ulong)e;
            if ((&ng_1)[uVar12] == 0) {
              uVar24 = e * iVar8 + iVar9;
              uVar24 = uVar24 - (uVar24 / 0xd + (uVar24 / 0xd) * 0xc);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
              local_19c8.fn = (_func_void_char_ptr_void_ptr *)0x0;
              local_19c8.data = (void *)0x0;
              local_19b8._0_15_ = SUB1615((undefined1  [16])0x0,0);
              local_19b8.data._7_1_ = (char)uVar24;
              psVar33 = psVar16;
              na_00 = (code *)(seed16 + ((long)local_1ae8 + -1) * 0x60);
              iVar11 = secp256k1_schnorrsig_sign_custom
                                 (psVar16,(uchar *)&tmp_3,(uchar *)&ng,0x20,
                                  (secp256k1_keypair *)(seed16 + ((long)local_1ae8 + -1) * 0x60),
                                  (secp256k1_schnorrsig_extraparams *)&e_1);
              if (iVar11 == 0) goto LAB_00114c03;
              lVar41 = 0;
              do {
                if (*(uchar *)((long)tmp_3.x.n + lVar41) !=
                    sStack_14f8.data[lVar41 + (long)local_1abc * 0x20 + 0x20]) goto LAB_00114c08;
                lVar41 = lVar41 + 1;
              } while (lVar41 != 0x20);
              lVar41 = 0;
              do {
                if (*(char *)((long)tmp_3.x.n + lVar41 + 0x20) !=
                    *(char *)((long)&local_19c8.fn + lVar41)) goto LAB_00114c0d;
                lVar41 = lVar41 + 1;
              } while (lVar41 != 0x20);
              (&ng_1)[uVar12] = 1;
              iVar39 = iVar39 + 1;
            }
          } while (iVar39 < 0xd);
        }
        iVar9 = local_1abc + 1;
        bVar47 = local_1abc < 0xc;
        local_1abc = iVar9;
      } while (bVar47);
      local_1ae8 = (secp256k1_gej *)((long)local_1ae8 + 1);
    } while (local_1ae8 != (secp256k1_gej *)0xd);
    local_1ae8 = (secp256k1_gej *)0x1;
    local_1ad8 = (secp256k1_scalar *)0x0;
    do {
      lVar41 = ((long)local_1ae8 + -1) * 0x20;
      local_1a58 = *(undefined1 (*) [16])(local_14a8 + lVar41);
      iVar8 = 0xd - (int)local_1ae8;
      if ((&iStack_1a3c)[(long)local_1ae8] == 0) {
        iVar8 = (int)local_1ae8;
      }
      local_1ab8 = (secp256k1_gej *)CONCAT44(local_1ab8._4_4_,iVar8);
      uStack_1a60 = *(undefined8 *)(local_14a8 + lVar41 + -8);
      _ng = *(undefined8 *)(&scalar_i + ((long)local_1ae8 + -1) * 8);
      local_1af0 = (secp256k1_gej *)((long)&generated.x + (long)local_1ae8 * 0x40 + -0x40);
      uVar12 = 1;
      do {
        local_1a88 = (undefined1  [16])0x0;
        local_1a98 = (undefined1  [16])0x0;
        _ng_1 = (undefined1  [16])0x0;
        local_1a78 = 0;
        if (((ulong)num_cores == 1) ||
           (local_1ad8 = (secp256k1_scalar *)((long)local_1ad8 + 0xe7037ed1a0b428db),
           (uint32_t)
           (((ulong)local_1ad8 >> 0x20 ^ (ulong)local_1ad8 & 0xffffffff) * (ulong)num_cores >> 0x20)
           == this_core)) {
          if (uVar12 < 7) {
            lVar41 = (uVar12 - 1) * 0x20;
            tmp_3.x.n._16_16_ = *(undefined1 (*) [16])(local_14a8 + lVar41);
            tmp_3.x.n[1] = *(uint64_t *)(local_14a8 + lVar41 + -8);
            tmp_3.x.n[0] = *(uint64_t *)(&scalar_i + (uVar12 - 1) * 8);
            iVar8 = 0xd - (int)uVar12;
            if ((&iStack_1a3c)[uVar12] == 0) {
              iVar8 = (int)uVar12;
            }
          }
          else {
            tmp_3.x.n._0_16_ = *(undefined1 (*) [16])(secp256k1_ellswift_c4.n + uVar12 * 4 + 2);
            tmp_3.x.n._16_16_ = *(undefined1 (*) [16])(secp256k1_ellswift_c4.n + uVar12 * 4 + 4);
            iVar8 = -1;
          }
          local_1ab0 = CONCAT44(local_1ab0._4_4_,(uint)(iVar8 != -1));
          iVar9 = 0;
          do {
            testrand256((uchar *)&local_19c8);
            na_00 = (code *)&ng;
            secp256k1_schnorrsig_challenge
                      (&e_1,(uchar *)&tmp_3,(uchar *)&local_19c8,0x20,(uchar *)na_00);
            uVar31 = _e_1 & 0xffffffff;
            if ((&ng_1)[uVar31] == 0) {
              uVar24 = (int)_e_1 * (int)local_1ab8 + iVar8;
              iVar11 = 0;
              iVar39 = 0;
              do {
                if (iVar11 == 0xe) {
                  testrand256((uchar *)(tmp_3.x.n + 4));
                  uVar19 = 0;
                }
                else {
                  tmp_3.x.n[4] = 0;
                  tmp_3.x.magnitude = 0;
                  tmp_3.x.normalized = 0;
                  tmp_3.y.n._0_15_ = SUB1615((undefined1  [16])0x0,0);
                  tmp_3.y.n[1]._7_1_ = (char)iVar11;
                  uVar19 = 0;
                  if (iVar11 != 0xd && iVar8 != -1) {
                    uVar19 = (uint)(uVar24 - (uVar24 / 0xd + (uVar24 / 0xd) * 0xc) == iVar11);
                  }
                }
                psVar33 = psVar16;
                na_00 = (code *)local_1af0;
                uVar20 = secp256k1_schnorrsig_verify
                                   (psVar16,(uchar *)&tmp_3,(uchar *)&local_19c8,0x20,
                                    (secp256k1_xonly_pubkey *)local_1af0);
                if (uVar20 != uVar19) goto LAB_00114c12;
                iVar39 = iVar39 + uVar19;
                iVar11 = iVar11 + 1;
              } while (iVar11 != 0xf);
              if (iVar39 != (int)local_1ab0) goto LAB_00114c17;
              (&ng_1)[uVar31] = 1;
              iVar9 = iVar9 + 1;
            }
          } while (iVar9 < 0xd);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != 0xe);
      local_1ae8 = (secp256k1_gej *)((long)local_1ae8 + 1);
    } while (local_1ae8 != (secp256k1_gej *)0x7);
    lVar41 = 0x68;
    uVar24 = 1;
    do {
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
      tmp_3.x.n[0] = 0;
      tmp_3.x.n[1] = 0;
      tmp_3.x.n._16_15_ = SUB1615((undefined1  [16])0x0,0);
      tmp_3.x.n[3]._7_1_ = (char)uVar24;
      psVar33 = psVar16;
      iVar8 = secp256k1_ellswift_create(psVar16,(uchar *)&generated,(uchar *)&tmp_3,(uchar *)0x0);
      if (iVar8 == 0) goto LAB_00114c1c;
      secp256k1_ellswift_decode(psVar16,(secp256k1_pubkey *)&scalar_i,(uchar *)&generated);
      psVar33 = (secp256k1_context *)seed16;
      secp256k1_pubkey_load(psVar16,(secp256k1_ge *)psVar33,(secp256k1_pubkey *)&scalar_i);
      iVar8 = secp256k1_ge_eq_var((secp256k1_ge *)psVar33,
                                  (secp256k1_ge *)((long)group[0].x.n + lVar41));
      if (iVar8 == 0) goto LAB_00114c21;
      lVar41 = lVar41 + 0x68;
      uVar24 = uVar24 + 1;
    } while (lVar41 != 0x548);
    secp256k1_context_destroy(psVar16);
    iVar8 = count;
  }
LAB_00114b40:
  main_cold_70();
LAB_00114b45:
  main_cold_66();
LAB_00114b4a:
  main_cold_65();
LAB_00114b4f:
  main_cold_74();
LAB_00114b54:
  main_cold_73();
LAB_00114b59:
  main_cold_72();
LAB_00114b5e:
  main_cold_11();
LAB_00114b63:
  main_cold_12();
LAB_00114b68:
  main_cold_13();
LAB_00114b6d:
  main_cold_14();
LAB_00114b72:
  main_cold_10();
LAB_00114b77:
  main_cold_15();
LAB_00114b7c:
  main_cold_16();
LAB_00114b81:
  main_cold_49();
LAB_00114b86:
  main_cold_17();
LAB_00114b8b:
  main_cold_18();
LAB_00114b90:
  main_cold_19();
LAB_00114b95:
  main_cold_20();
LAB_00114b9a:
  main_cold_21();
LAB_00114b9f:
  main_cold_48();
LAB_00114ba4:
  main_cold_47();
LAB_00114ba9:
  main_cold_46();
LAB_00114bae:
  main_cold_45();
LAB_00114bb3:
  main_cold_44();
LAB_00114bb8:
  main_cold_43();
LAB_00114bbd:
  main_cold_22();
LAB_00114bc2:
  main_cold_42();
LAB_00114bc7:
  main_cold_23();
LAB_00114bcc:
  main_cold_41();
LAB_00114bd1:
  main_cold_24();
LAB_00114bd6:
  main_cold_40();
LAB_00114bdb:
  main_cold_39();
LAB_00114be0:
  main_cold_25();
LAB_00114be5:
  main_cold_26();
LAB_00114bea:
  main_cold_27();
LAB_00114bef:
  main_cold_28();
LAB_00114bf4:
  main_cold_38();
LAB_00114bf9:
  main_cold_37();
LAB_00114bfe:
  main_cold_36();
LAB_00114c03:
  main_cold_35();
LAB_00114c08:
  main_cold_29();
LAB_00114c0d:
  main_cold_30();
LAB_00114c12:
  main_cold_31();
LAB_00114c17:
  main_cold_32();
LAB_00114c1c:
  main_cold_34();
LAB_00114c21:
  main_cold_33();
  lVar41 = 0;
  do {
    uVar36 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
             secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
    uVar38 = secp256k1_test_state[1] << 0x11;
    uVar31 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar12 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar31;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar12;
    secp256k1_test_state[3] = uVar12 << 0x2d | uVar12 >> 0x13;
    secp256k1_test_state[2] = uVar31 ^ uVar38;
    (psVar33->ecmult_gen_ctx).ge_offset.x.n[lVar41 + -1] = uVar36;
    lVar41 = lVar41 + 1;
  } while ((int)lVar41 != 4);
  return (int)secp256k1_test_state[0];
}

Assistant:

int main(int argc, char** argv) {
    int i;
    secp256k1_gej groupj[EXHAUSTIVE_TEST_ORDER];
    secp256k1_ge group[EXHAUSTIVE_TEST_ORDER];
    unsigned char rand32[32];
    secp256k1_context *ctx;

    /* Disable buffering for stdout to improve reliability of getting
     * diagnostic information. Happens right at the start of main because
     * setbuf must be used before any other operation on the stream. */
    setbuf(stdout, NULL);
    /* Also disable buffering for stderr because it's not guaranteed that it's
     * unbuffered on all systems. */
    setbuf(stderr, NULL);

    printf("Exhaustive tests for order %lu\n", (unsigned long)EXHAUSTIVE_TEST_ORDER);

    /* find iteration count */
    if (argc > 1) {
        count = strtol(argv[1], NULL, 0);
    }
    printf("test count = %i\n", count);

    /* find random seed */
    testrand_init(argc > 2 ? argv[2] : NULL);

    /* set up split processing */
    if (argc > 4) {
        num_cores = strtol(argv[3], NULL, 0);
        this_core = strtol(argv[4], NULL, 0);
        if (num_cores < 1 || this_core >= num_cores) {
            fprintf(stderr, "Usage: %s [count] [seed] [numcores] [thiscore]\n", argv[0]);
            return 1;
        }
        printf("running tests for core %lu (out of [0..%lu])\n", (unsigned long)this_core, (unsigned long)num_cores - 1);
    }

    /* Recreate the ecmult{,_gen} tables using the right generator (as selected via EXHAUSTIVE_TEST_ORDER) */
    secp256k1_ecmult_gen_compute_table(&secp256k1_ecmult_gen_prec_table[0][0], &secp256k1_ge_const_g, COMB_BLOCKS, COMB_TEETH, COMB_SPACING);
    secp256k1_ecmult_compute_two_tables(secp256k1_pre_g, secp256k1_pre_g_128, WINDOW_G, &secp256k1_ge_const_g);

    while (count--) {
        /* Build context */
        ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
        testrand256(rand32);
        CHECK(secp256k1_context_randomize(ctx, rand32));

        /* Generate the entire group */
        secp256k1_gej_set_infinity(&groupj[0]);
        secp256k1_ge_set_gej(&group[0], &groupj[0]);
        for (i = 1; i < EXHAUSTIVE_TEST_ORDER; i++) {
            secp256k1_gej_add_ge(&groupj[i], &groupj[i - 1], &secp256k1_ge_const_g);
            secp256k1_ge_set_gej(&group[i], &groupj[i]);
            if (count != 0) {
                /* Set a different random z-value for each Jacobian point, except z=1
                   is used in the last iteration. */
                secp256k1_fe z;
                testutil_random_fe(&z);
                secp256k1_gej_rescale(&groupj[i], &z);
            }

            /* Verify against ecmult_gen */
            {
                secp256k1_scalar scalar_i;
                secp256k1_gej generatedj;
                secp256k1_ge generated;

                secp256k1_scalar_set_int(&scalar_i, i);
                secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &generatedj, &scalar_i);
                secp256k1_ge_set_gej(&generated, &generatedj);

                CHECK(group[i].infinity == 0);
                CHECK(generated.infinity == 0);
                CHECK(secp256k1_fe_equal(&generated.x, &group[i].x));
                CHECK(secp256k1_fe_equal(&generated.y, &group[i].y));
            }
        }

        /* Run the tests */
        test_exhaustive_endomorphism(group);
        test_exhaustive_addition(group, groupj);
        test_exhaustive_ecmult(group, groupj);
        test_exhaustive_ecmult_multi(ctx, group);
        test_exhaustive_sign(ctx, group);
        test_exhaustive_verify(ctx, group);

#ifdef ENABLE_MODULE_RECOVERY
        test_exhaustive_recovery(ctx, group);
#endif
#ifdef ENABLE_MODULE_EXTRAKEYS
        test_exhaustive_extrakeys(ctx, group);
#endif
#ifdef ENABLE_MODULE_SCHNORRSIG
        test_exhaustive_schnorrsig(ctx);
#endif
#ifdef ENABLE_MODULE_ELLSWIFT
    /* The ellswift algorithm does have additional edge cases when operating on
     * curves of even order, which are not included in the code as secp256k1 is
     * of odd order. Skip the ellswift tests if the used exhaustive tests curve
     * is even-ordered accordingly. */
    #if !EXHAUSTIVE_TEST_CURVE_HAS_EVEN_ORDER
        test_exhaustive_ellswift(ctx, group);
    #endif
#endif

        secp256k1_context_destroy(ctx);
    }

    testrand_finish();

    printf("no problems found\n");
    return 0;
}